

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry_&> __thiscall
kj::
Table<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Entry,kj::HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>>
::find<0ul,capnp::_::RawSchema*&>
          (Table<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Entry,kj::HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>>
           *this,RawSchema **params)

{
  Entry *pEVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_RDX;
  ArrayPtr<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry> AVar3;
  unsigned_long *pos;
  Entry *local_50;
  RawSchema **local_48;
  Maybe<unsigned_long> local_40;
  undefined1 local_30 [8];
  NullableValue<unsigned_long> _pos583;
  RawSchema **params_local;
  Table<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry,_kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Callbacks>_>
  *this_local;
  
  _pos583.field_1 = in_RDX;
  pEVar1 = (Entry *)get<0ul,kj::HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>&>
                              ((TreeIndex<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Callbacks>
                                *)(params + 4));
  AVar3 = Vector<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>::
          asPtr((Vector<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>
                 *)params);
  fwd<capnp::_::RawSchema*&>((RawSchema **)_pos583.field_1);
  local_50 = AVar3.ptr;
  local_48 = (RawSchema **)AVar3.size_;
  AVar3.size_ = (size_t)local_50;
  AVar3.ptr = pEVar1;
  HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>::
  find<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Entry,capnp::_::RawSchema*&>
            ((HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>
              *)&local_40,AVar3,local_48);
  other = _::readMaybe<unsigned_long>(&local_40);
  _::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_30,other);
  Maybe<unsigned_long>::~Maybe(&local_40);
  puVar2 = _::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_30);
  if (puVar2 == (unsigned_long *)0x0) {
    Maybe<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry_&>::Maybe
              ((Maybe<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry_&>
                *)this);
  }
  else {
    puVar2 = _::NullableValue<unsigned_long>::operator*((NullableValue<unsigned_long> *)local_30);
    pEVar1 = Vector<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>::
             operator[]((Vector<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>
                         *)params,*puVar2);
    Maybe<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry_&>::Maybe
              ((Maybe<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry_&>
                *)this,pEVar1);
  }
  _::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_30);
  return (Maybe<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry_&>)
         (Entry *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}